

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O1

void __thiscall deqp::egl::ApiCase::expectNoSurface(ApiCase *this,EGLSurface got)

{
  ostringstream *this_00;
  TestContext *this_01;
  undefined1 local_198 [384];
  
  if (got != (EGLSurface)0x0) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR expected: EGL_NO_SURFACE",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid value");
    }
    eglu::CallLogWrapper::eglDestroySurface(&this->super_CallLogWrapper,this->m_display,got);
  }
  return;
}

Assistant:

void ApiCase::expectNoSurface (EGLSurface got)
{
	if (got != EGL_NO_SURFACE)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: EGL_NO_SURFACE" << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
		eglDestroySurface(getDisplay(), got);
	}
}